

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuAstcUtil.cpp
# Opt level: O0

void tcu::astc::anon_unknown_0::generateRandomBlock(deUint8 *dst,IVec3 *blockSize,Random *rnd)

{
  deUint32 dVar1;
  Random *pRVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  float fVar6;
  deInt32 local_d2c;
  byte *local_d28;
  ISEMode local_d20;
  int local_d18;
  int local_d14;
  deUint32 local_d0c;
  deUint32 local_d08;
  deUint32 local_d04;
  bool local_ce9;
  deUint16 local_ce8;
  deFloat16 local_ce6;
  deFloat16 local_ce4;
  deFloat16 local_ce2;
  AssignBlock128 local_ce0;
  int local_ccc;
  deUint32 local_cc8;
  int valueNdx;
  int rangeMax;
  int i_1;
  int iseBlockNdx;
  int numISEBlocks;
  int iseBitMax;
  int numValuesPerISEBlock;
  ISEInput *iseInput;
  int iStack_ca0;
  ISEParams iseParams;
  int numValues;
  undefined1 local_c90 [3];
  bool setWeights;
  int weightOrEndpoints;
  NormalBlockISEInputs iseInputs;
  int i;
  int cemDiff;
  NormalBlockParams blockParams;
  AssignBlock128 local_40;
  deUint16 local_2a;
  deFloat16 local_28;
  deFloat16 local_26;
  deFloat16 local_24;
  deUint16 a;
  deUint16 b;
  deUint16 g;
  deUint16 r;
  bool isVoidExtentHDR;
  Random *rnd_local;
  IVec3 *blockSize_local;
  deUint8 *dst_local;
  
  _b = rnd;
  rnd_local = (Random *)blockSize;
  blockSize_local = (IVec3 *)dst;
  fVar6 = de::Random::getFloat(rnd);
  if (0.1 <= fVar6) {
    NormalBlockParams::NormalBlockParams((NormalBlockParams *)&i);
    do {
      pRVar2 = _b;
      iVar4 = Vector<int,_3>::x((Vector<int,_3> *)rnd_local);
      i = de::Random::getInt(pRVar2,2,iVar4);
      pRVar2 = _b;
      iVar4 = Vector<int,_3>::y((Vector<int,_3> *)rnd_local);
      cemDiff = de::Random::getInt(pRVar2,2,iVar4);
      iVar4 = de::Random::getInt(_b,0,0xb);
      blockParams._0_8_ =
           *(undefined8 *)((anonymous_namespace)::s_weightISEParamsCandidates + (long)iVar4 * 8);
      blockParams._16_4_ = de::Random::getInt(_b,1,4);
      fVar6 = de::Random::getFloat(_b);
      blockParams.colorEndpointModes[2]._0_1_ = fVar6 < 0.25;
      local_ce9 = false;
      if (blockParams._16_4_ != 4) {
        local_ce9 = de::Random::getBool(_b);
      }
      blockParams.weightISEParams.mode._0_1_ = local_ce9;
      blockParams.weightISEParams.numBits = de::Random::getInt(_b,0,3);
      blockParams.colorEndpointModes[3] = de::Random::getInt(_b,0,0x3ff);
      blockParams.ccs = de::Random::getInt(_b,0,0xf);
      if (((byte)blockParams.colorEndpointModes[2] & 1) == 0) {
        if (blockParams.ccs == 0) {
          local_d08 = 1;
        }
        else {
          if (blockParams.ccs == 0xf) {
            local_d0c = 0xffffffff;
          }
          else {
            bVar3 = de::Random::getBool(_b);
            local_d0c = 0xffffffff;
            if (bVar3) {
              local_d0c = 1;
            }
          }
          local_d08 = local_d0c;
        }
        local_d04 = local_d08;
      }
      else {
        local_d04 = 0;
      }
      iseInputs.endpoint.value.block[0x3f].bitValues[4] = local_d04;
      for (iseInputs.endpoint.value.block[0x3f].bitValues[3] = 1; dVar1 = blockParams.ccs,
          (int)iseInputs.endpoint.value.block[0x3f].bitValues[3] < (int)blockParams._16_4_;
          iseInputs.endpoint.value.block[0x3f].bitValues[3] =
               iseInputs.endpoint.value.block[0x3f].bitValues[3] + 1) {
        if (iseInputs.endpoint.value.block[0x3f].bitValues[4] == 0xffffffff) {
          local_d14 = de::Random::getInt(_b,-1,0);
        }
        else {
          if (iseInputs.endpoint.value.block[0x3f].bitValues[4] == 1) {
            local_d18 = de::Random::getInt(_b,0,1);
          }
          else {
            local_d18 = 0;
          }
          local_d14 = local_d18;
        }
        blockParams.colorEndpointModes
        [(long)(int)iseInputs.endpoint.value.block[0x3f].bitValues[3] + -2] = dVar1 + local_d14;
      }
      iVar4 = Vector<int,_3>::x((Vector<int,_3> *)rnd_local);
      iVar5 = Vector<int,_3>::y((Vector<int,_3> *)rnd_local);
      bVar3 = isValidBlockParams((NormalBlockParams *)&i,iVar4,iVar5);
    } while (((bVar3 ^ 0xffU) & 1) != 0);
    NormalBlockISEInputs::NormalBlockISEInputs((NormalBlockISEInputs *)local_c90);
    for (numValues = 0; numValues < 2; numValues = numValues + 1) {
      iseParams.numBits._3_1_ = numValues == 0;
      if ((bool)iseParams.numBits._3_1_) {
        local_d20 = computeNumWeights((NormalBlockParams *)&i);
      }
      else {
        local_d20 = computeNumColorEndpointValues
                              (&blockParams.ccs,blockParams._16_4_,
                               (bool)((byte)blockParams.colorEndpointModes[2] & 1));
      }
      iseParams.mode = local_d20;
      if ((iseParams.numBits._3_1_ & 1) == 0) {
        iVar4 = computeNumBitsForColorEndpoints((NormalBlockParams *)&i);
        register0x00000000 = computeMaximumRangeISEParams(iVar4,iseParams.mode);
      }
      else {
        iseInput._4_4_ = blockParams.weightGridWidth;
        iStack_ca0 = blockParams.weightGridHeight;
      }
      if ((iseParams.numBits._3_1_ & 1) == 0) {
        local_d28 = (byte *)((long)&iseInputs.weight.value + 0x5f8);
      }
      else {
        local_d28 = local_c90;
      }
      _iseBitMax = local_d28;
      bVar3 = de::Random::getBool(_b);
      *_iseBitMax = bVar3;
      if ((*_iseBitMax & 1) == 0) {
        local_cc8 = computeISERangeMax((ISEParams *)((long)&iseInput + 4));
        for (local_ccc = 0; local_ccc < (int)iseParams.mode; local_ccc = local_ccc + 1) {
          iVar4 = de::Random::getInt(_b,0,local_cc8);
          *(int *)(_iseBitMax + (long)local_ccc * 4 + 4) = iVar4;
        }
      }
      else {
        if (iseInput._4_4_ == ISEMODE_TRIT) {
          local_d2c = 5;
        }
        else {
          local_d2c = 1;
          if (iseInput._4_4_ == ISEMODE_QUINT) {
            local_d2c = 3;
          }
        }
        numISEBlocks = local_d2c;
        iseBlockNdx = (1 << (iseInput._8_1_ & 0x1f)) + -1;
        i_1 = deDivRoundUp32(iseParams.mode,local_d2c);
        for (rangeMax = 0; rangeMax < i_1; rangeMax = rangeMax + 1) {
          iVar4 = de::Random::getInt(_b,0,0xff);
          *(int *)(_iseBitMax + (long)rangeMax * 0x18 + 4) = iVar4;
          for (valueNdx = 0; valueNdx < numISEBlocks; valueNdx = valueNdx + 1) {
            iVar4 = de::Random::getInt(_b,0,iseBlockNdx);
            *(int *)(_iseBitMax + (long)valueNdx * 4 + (long)rangeMax * 0x18 + 8) = iVar4;
          }
        }
      }
    }
    iVar4 = Vector<int,_3>::x((Vector<int,_3> *)rnd_local);
    iVar5 = Vector<int,_3>::y((Vector<int,_3> *)rnd_local);
    local_ce0 = generateNormalBlock((NormalBlockParams *)&i,iVar4,iVar5,
                                    (NormalBlockISEInputs *)local_c90);
    AssignBlock128::assignToMemory(&local_ce0,(deUint8 *)blockSize_local);
  }
  else {
    a._1_1_ = de::Random::getBool(_b);
    if ((bool)a._1_1_) {
      fVar6 = de::Random::getFloat(_b,0.0,1.0);
      local_ce2 = deFloat32To16(fVar6);
    }
    else {
      iVar4 = de::Random::getInt(_b,0,0xffff);
      local_ce2 = (deFloat16)iVar4;
    }
    local_24 = local_ce2;
    if ((a._1_1_ & 1) == 0) {
      iVar4 = de::Random::getInt(_b,0,0xffff);
      local_ce4 = (deFloat16)iVar4;
    }
    else {
      fVar6 = de::Random::getFloat(_b,0.0,1.0);
      local_ce4 = deFloat32To16(fVar6);
    }
    local_26 = local_ce4;
    if ((a._1_1_ & 1) == 0) {
      iVar4 = de::Random::getInt(_b,0,0xffff);
      local_ce6 = (deFloat16)iVar4;
    }
    else {
      fVar6 = de::Random::getFloat(_b,0.0,1.0);
      local_ce6 = deFloat32To16(fVar6);
    }
    local_28 = local_ce6;
    if ((a._1_1_ & 1) == 0) {
      iVar4 = de::Random::getInt(_b,0,0xffff);
      local_ce8 = (deUint16)iVar4;
    }
    else {
      fVar6 = de::Random::getFloat(_b,0.0,1.0);
      local_ce8 = deFloat32To16(fVar6);
    }
    local_2a = local_ce8;
    VoidExtentParams::VoidExtentParams
              ((VoidExtentParams *)&blockParams.field_0x2e,(bool)(a._1_1_ & 1),local_24,local_26,
               local_28,local_ce8);
    local_40 = generateVoidExtentBlock((VoidExtentParams *)&blockParams.field_0x2e);
    AssignBlock128::assignToMemory(&local_40,(deUint8 *)blockSize_local);
  }
  return;
}

Assistant:

void generateRandomBlock (deUint8* dst, const IVec3& blockSize, de::Random& rnd)
{
	DE_ASSERT(blockSize.z() == 1);

	if (rnd.getFloat() < 0.1f)
	{
		// Void extent block.
		const bool		isVoidExtentHDR		= rnd.getBool();
		const deUint16	r					= isVoidExtentHDR ? deFloat32To16(rnd.getFloat(0.0f, 1.0f)) : (deUint16)rnd.getInt(0, 0xffff);
		const deUint16	g					= isVoidExtentHDR ? deFloat32To16(rnd.getFloat(0.0f, 1.0f)) : (deUint16)rnd.getInt(0, 0xffff);
		const deUint16	b					= isVoidExtentHDR ? deFloat32To16(rnd.getFloat(0.0f, 1.0f)) : (deUint16)rnd.getInt(0, 0xffff);
		const deUint16	a					= isVoidExtentHDR ? deFloat32To16(rnd.getFloat(0.0f, 1.0f)) : (deUint16)rnd.getInt(0, 0xffff);
		generateVoidExtentBlock(VoidExtentParams(isVoidExtentHDR, r, g, b, a)).assignToMemory(dst);
	}
	else
	{
		// Not void extent block.

		// Generate block params.

		NormalBlockParams blockParams;

		do
		{
			blockParams.weightGridWidth				= rnd.getInt(2, blockSize.x());
			blockParams.weightGridHeight			= rnd.getInt(2, blockSize.y());
			blockParams.weightISEParams				= s_weightISEParamsCandidates[rnd.getInt(0, DE_LENGTH_OF_ARRAY(s_weightISEParamsCandidates)-1)];
			blockParams.numPartitions				= rnd.getInt(1, 4);
			blockParams.isMultiPartSingleCemMode	= rnd.getFloat() < 0.25f;
			blockParams.isDualPlane					= blockParams.numPartitions != 4 && rnd.getBool();
			blockParams.ccs							= rnd.getInt(0, 3);
			blockParams.partitionSeed				= rnd.getInt(0, 1023);

			blockParams.colorEndpointModes[0] = rnd.getInt(0, 15);

			{
				const int cemDiff = blockParams.isMultiPartSingleCemMode		? 0
									: blockParams.colorEndpointModes[0] == 0	? 1
									: blockParams.colorEndpointModes[0] == 15	? -1
									: rnd.getBool()								? 1 : -1;

				for (int i = 1; i < blockParams.numPartitions; i++)
					blockParams.colorEndpointModes[i] = blockParams.colorEndpointModes[0] + (cemDiff == -1 ? rnd.getInt(-1, 0) : cemDiff == 1 ? rnd.getInt(0, 1) : 0);
			}
		} while (!isValidBlockParams(blockParams, blockSize.x(), blockSize.y()));

		// Generate ISE inputs for both weight and endpoint data.

		NormalBlockISEInputs iseInputs;

		for (int weightOrEndpoints = 0; weightOrEndpoints <= 1; weightOrEndpoints++)
		{
			const bool			setWeights	= weightOrEndpoints == 0;
			const int			numValues	= setWeights ? computeNumWeights(blockParams) :
												computeNumColorEndpointValues(&blockParams.colorEndpointModes[0], blockParams.numPartitions, blockParams.isMultiPartSingleCemMode);
			const ISEParams		iseParams	= setWeights ? blockParams.weightISEParams : computeMaximumRangeISEParams(computeNumBitsForColorEndpoints(blockParams), numValues);
			ISEInput&			iseInput	= setWeights ? iseInputs.weight : iseInputs.endpoint;

			iseInput.isGivenInBlockForm = rnd.getBool();

			if (iseInput.isGivenInBlockForm)
			{
				const int numValuesPerISEBlock	= iseParams.mode == ISEMODE_TRIT	? 5
												: iseParams.mode == ISEMODE_QUINT	? 3
												:									  1;
				const int iseBitMax				= (1 << iseParams.numBits) - 1;
				const int numISEBlocks			= deDivRoundUp32(numValues, numValuesPerISEBlock);

				for (int iseBlockNdx = 0; iseBlockNdx < numISEBlocks; iseBlockNdx++)
				{
					iseInput.value.block[iseBlockNdx].tOrQValue = rnd.getInt(0, 255);
					for (int i = 0; i < numValuesPerISEBlock; i++)
						iseInput.value.block[iseBlockNdx].bitValues[i] = rnd.getInt(0, iseBitMax);
				}
			}
			else
			{
				const int rangeMax = computeISERangeMax(iseParams);

				for (int valueNdx = 0; valueNdx < numValues; valueNdx++)
					iseInput.value.plain[valueNdx] = rnd.getInt(0, rangeMax);
			}
		}

		generateNormalBlock(blockParams, blockSize.x(), blockSize.y(), iseInputs).assignToMemory(dst);
	}
}